

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.test_case.cpp
# Opt level: O2

string * __thiscall mon::test_case::name_abi_cxx11_(string *__return_storage_ptr__,test_case *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

string test_case::name() const
    {
        return name_;
    }